

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool __thiscall ON_Brep::SetTrimBoundingBox(ON_Brep *this,ON_BrepTrim *trim,bool bLazy)

{
  ON_BoundingBox *this_00;
  bool bVar1;
  ON_Curve *pOVar2;
  ON_BoundingBox local_50;
  
  this_00 = &trim->m_pbox;
  bVar1 = ON_BoundingBox::IsValid(this_00);
  if (!bVar1 || !bLazy) {
    ON_BoundingBox::Destroy(this_00);
    pOVar2 = ON_CurveProxy::ProxyCurve(&trim->super_ON_CurveProxy);
    if (pOVar2 != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_50,(ON_Geometry *)trim);
      (trim->m_pbox).m_max.y = local_50.m_max.y;
      (trim->m_pbox).m_max.z = local_50.m_max.z;
      (trim->m_pbox).m_min.z = local_50.m_min.z;
      (trim->m_pbox).m_max.x = local_50.m_max.x;
      (this_00->m_min).x = local_50.m_min.x;
      (trim->m_pbox).m_min.y = local_50.m_min.y;
      (trim->m_pbox).m_min.z = 0.0;
      (trim->m_pbox).m_max.z = 0.0;
    }
  }
  bVar1 = ON_BoundingBox::IsValid(this_00);
  return bVar1;
}

Assistant:

bool ON_Brep::SetTrimBoundingBox( ON_BrepTrim& trim, bool bLazy )
{
  // TL_Brep overrides this function and computes much 
  // tighter bounding boxes that take trim.m_t[] into account.
  bool rc = true;
  if ( !trim.m_pbox.IsValid() || !bLazy )
  {
    trim.m_pbox.Destroy();
    if ( trim.ProxyCurve() )
    {
      trim.m_pbox = trim.BoundingBox();
      trim.m_pbox.m_min.z = 0.0;
      trim.m_pbox.m_max.z = 0.0;
    }
  }
  return (rc && trim.m_pbox.IsValid()) ? true : false;
}